

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentence_test.cpp
# Opt level: O3

void __thiscall
jhu::thrax::SentenceTests_AlignedSentencePairSpan_Test::TestBody
          (SentenceTests_AlignedSentencePairSpan_Test *this)

{
  void *pvVar1;
  bool bVar2;
  char *in_RCX;
  char *pcVar3;
  string_view line;
  AssertionResult gtest_ar;
  SpanPair sp;
  AlignedSentencePair pair;
  Message local_78;
  AssertHelper local_70;
  internal local_68 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  undefined8 local_58;
  AlignedSentencePair local_50;
  
  line._M_str = in_RCX;
  line._M_len = (size_t)"foo bar baz\tqux\t0-0 1-0 2-0";
  readAlignedSentencePair<false,false>(&local_50,(thrax *)0x1b,line);
  local_58 = (ulong)(((int)local_50.src.
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                      (int)local_50.src.
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start & 0xfffffff0U) << 0xc) |
             (ulong)(uint)((int)local_50.tgt.
                                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (int)local_50.tgt.
                               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) << 0x2c;
  local_78.ss_.ptr_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,short>
            (local_68,"0","sp.src.start",(int *)&local_78,(short *)&local_58);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message(&local_78);
    if (local_60.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_60.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/sentence_test.cpp"
               ,0x4a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.ss_.ptr_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,short>
            (local_68,"3","sp.src.end",(int *)&local_78,(short *)((long)&local_58 + 2));
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message(&local_78);
    if (local_60.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_60.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/sentence_test.cpp"
               ,0x4b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.ss_.ptr_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,short>
            (local_68,"0","sp.tgt.start",(int *)&local_78,(short *)((long)&local_58 + 4));
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message(&local_78);
    if (local_60.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_60.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/sentence_test.cpp"
               ,0x4c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.ss_.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,short>
            (local_68,"1","sp.tgt.end",(int *)&local_78,(short *)((long)&local_58 + 6));
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message(&local_78);
    if (local_60.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_60.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/sentence_test.cpp"
               ,0x4d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_50.alignment.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.alignment.
                    super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.alignment.
                          super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.alignment.
                          super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pvVar1 = (void *)CONCAT44(local_50.tgt.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            (int)local_50.tgt.
                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_50.tgt.
                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  pvVar1 = (void *)CONCAT44(local_50.src.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            (int)local_50.src.
                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_50.src.
                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  return;
}

Assistant:

TEST(SentenceTests, AlignedSentencePairSpan) {
  std::string_view line = "foo bar baz\tqux\t0-0 1-0 2-0";
  auto pair = readAlignedSentencePair<false, false>(line);
  auto sp = pair.span();
  EXPECT_EQ(0, sp.src.start);
  EXPECT_EQ(3, sp.src.end);
  EXPECT_EQ(0, sp.tgt.start);
  EXPECT_EQ(1, sp.tgt.end);
}